

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorcerer.c
# Opt level: O0

void spell_scathing(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  CHAR_DATA *pCVar1;
  ulong uVar2;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  CHAR_DATA *in_RDX;
  int in_EDI;
  __type_conflict2 _Var6;
  char buf [4608];
  int dam;
  AFFECT_DATA af;
  CHAR_DATA *vch_next;
  CHAR_DATA *vch;
  undefined4 in_stack_ffffffffffffed18;
  int in_stack_ffffffffffffed1c;
  int in_stack_ffffffffffffed20;
  undefined4 in_stack_ffffffffffffed24;
  undefined4 in_stack_ffffffffffffed28;
  undefined4 in_stack_ffffffffffffed2c;
  char *in_stack_ffffffffffffed30;
  char *in_stack_ffffffffffffed50;
  CHAR_DATA *in_stack_ffffffffffffed58;
  int in_stack_ffffffffffffed60;
  CHAR_DATA *local_28;
  
  send_to_char(in_stack_ffffffffffffed30,
               (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed2c,in_stack_ffffffffffffed28));
  act(in_stack_ffffffffffffed30,
      (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed2c,in_stack_ffffffffffffed28),
      (void *)CONCAT44(in_stack_ffffffffffffed24,in_stack_ffffffffffffed20),
      (void *)CONCAT44(in_stack_ffffffffffffed1c,in_stack_ffffffffffffed18),0);
  init_affect((AFFECT_DATA *)0x6d7a9c);
  std::pow<int,int>(0,0x6d7af9);
  pCVar1 = in_RDX->in_room->people;
  while (local_28 = pCVar1, local_28 != (CHAR_DATA *)0x0) {
    pCVar1 = local_28->next_in_room;
    bVar3 = is_same_group(local_28,in_RDX);
    if (((!bVar3) &&
        (bVar3 = is_safe((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed24,in_stack_ffffffffffffed20),
                         (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed1c,in_stack_ffffffffffffed18))
        , !bVar3)) && (bVar3 = is_same_cabal(in_RDX,local_28), !bVar3)) {
      bVar3 = is_npc((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed1c,in_stack_ffffffffffffed18));
      if (((!bVar3) &&
          (bVar3 = is_npc((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed1c,in_stack_ffffffffffffed18)
                         ), !bVar3)) &&
         ((in_RDX->fighting == (CHAR_DATA *)0x0 || (local_28->fighting == (CHAR_DATA *)0x0)))) {
        in_stack_ffffffffffffed50 = &stack0xffffffffffffed58;
        pcVar5 = pers((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed2c,in_stack_ffffffffffffed28),
                      (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed24,in_stack_ffffffffffffed20));
        snprintf(in_stack_ffffffffffffed50,0x1200,"Die, %s you sorcerous dog!",pcVar5);
        do_myell((CHAR_DATA *)in_stack_ffffffffffffed30,
                 (char *)CONCAT44(in_stack_ffffffffffffed2c,in_stack_ffffffffffffed28),
                 (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed24,in_stack_ffffffffffffed20));
      }
      dice(in_stack_ffffffffffffed20,in_stack_ffffffffffffed1c);
      saves_spell(in_stack_ffffffffffffed60,in_stack_ffffffffffffed58,
                  (int)((ulong)in_stack_ffffffffffffed50 >> 0x20));
      iVar4 = number_percent();
      if (((iVar4 < 0x15) && (bVar3 = is_affected(local_28,in_EDI), !bVar3)) &&
         ((uVar2 = local_28->act[0], _Var6 = std::pow<int,int>(0,0x6d7cf0),
          (uVar2 & (long)_Var6) == 0 &&
          (uVar2 = local_28->form[0], _Var6 = std::pow<int,int>(0,0x6d7d26),
          (uVar2 & (long)_Var6) == 0)))) {
        act(in_stack_ffffffffffffed30,
            (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed2c,in_stack_ffffffffffffed28),
            (void *)CONCAT44(in_stack_ffffffffffffed24,in_stack_ffffffffffffed20),
            (void *)CONCAT44(in_stack_ffffffffffffed1c,in_stack_ffffffffffffed18),0);
        send_to_char(in_stack_ffffffffffffed30,
                     (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed2c,in_stack_ffffffffffffed28));
        affect_to_char((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed24,in_stack_ffffffffffffed20),
                       (AFFECT_DATA *)CONCAT44(in_stack_ffffffffffffed1c,in_stack_ffffffffffffed18))
        ;
      }
      in_stack_ffffffffffffed18 = 0;
      in_stack_ffffffffffffed20 = 0;
      in_stack_ffffffffffffed28 = 1;
      in_stack_ffffffffffffed30 = "scathing wind";
      damage_new((CHAR_DATA *)buf._104_8_,(CHAR_DATA *)buf._96_8_,buf._92_4_,buf._88_4_,buf._84_4_,
                 (bool)buf[0x53],(bool)buf[0x52],buf._136_4_,buf._144_4_,(char *)buf._152_8_);
    }
  }
  return;
}

Assistant:

void spell_scathing(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *vch, *vch_next;
	AFFECT_DATA af;
	int dam;
	char buf[MSL];

	send_to_char("You create violent, scorching gusts of wind to sweep across the area.\n\r", ch);
	act("Heat radiates from $n's fingertips as a scathing wind sweeps across the area.", ch, 0, 0, TO_ROOM);

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.level = level;
	af.type = sn;
	af.aftype = AFT_SPELL;
	af.location = APPLY_HITROLL;
	af.modifier = -4;
	af.duration = 0;

	SET_BIT(af.bitvector, AFF_BLIND);
	af.mod_name = MOD_VISION;

	for (vch = ch->in_room->people; vch != nullptr; vch = vch_next)
	{
		vch_next = vch->next_in_room;

		if (is_same_group(vch, ch) || is_safe(ch, vch) || is_same_cabal(ch, vch))
			continue;

		if (!is_npc(ch) && !is_npc(vch) && (ch->fighting == nullptr || vch->fighting == nullptr))
		{
			std::snprintf(buf, static_cast<int>(MSL), "Die, %s you sorcerous dog!", pers(ch, vch));
			do_myell(vch, buf, ch);
		}

		dam = dice((int)(.66 * (float)level), 9);

		if (saves_spell(level, vch, DAM_FIRE))
			dam /= 2;

		if (number_percent() <= 20
			&& !is_affected(vch, sn)
			&& !(IS_SET(vch->act, ACT_UNDEAD) || IS_SET(vch->form, FORM_UNDEAD)))
		{
			act("The heated air sears $n's eyes, blinding $m!", vch, 0, 0, TO_ROOM);
			send_to_char("The heated air sears your eyes, blinding you!\n\r", vch);
			affect_to_char(vch, &af);
		}

		damage_new(ch, vch, dam, TYPE_UNDEFINED, DAM_FIRE, true, HIT_UNBLOCKABLE, HIT_NOADD, HIT_NOMULT, "scathing wind");
	}
}